

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O2

string * __thiscall
license::CryptoHelperLinux::exportPrivateKey_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this)

{
  BIO_METHOD *type;
  BIO *bp;
  rsa_st *x;
  long lVar1;
  char *data;
  logic_error *this_00;
  allocator local_49;
  allocator local_48 [32];
  
  if (this->m_pktmp != (EVP_PKEY *)0x0) {
    type = BIO_s_mem();
    bp = BIO_new(type);
    x = EVP_PKEY_get1_RSA((EVP_PKEY *)this->m_pktmp);
    PEM_write_bio_RSAPrivateKey(bp,x,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0)
    ;
    lVar1 = BIO_ctrl(bp,10,0,(void *)0x0);
    data = (char *)calloc((long)((int)lVar1 + 1),1);
    BIO_read(bp,data,(int)lVar1);
    BIO_free(bp);
    std::__cxx11::string::string((string *)__return_storage_ptr__,data,local_48);
    free(data);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_48,"Export not initialized.Call generateKeyPair first.",&local_49);
  std::logic_error::logic_error(this_00,(string *)local_48);
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const string CryptoHelperLinux::exportPrivateKey() const {
	if (m_pktmp == NULL) {
		throw logic_error(string("Export not initialized.Call generateKeyPair first."));
	}
	BIO *bio_private = BIO_new(BIO_s_mem());
	RSA *rsa = EVP_PKEY_get1_RSA(m_pktmp);
	// EVP_PKEY_assign_RSA(m_pktmp, rsa);
	PEM_write_bio_RSAPrivateKey(bio_private, rsa, NULL, NULL, 0, NULL, NULL);
	// RSA_free(rsa);
	/*PEM_write_bio_PrivateKey(bio_private, m_pktmp, nullptr, nullptr, 0,
	 nullptr, nullptr);*/
	int keylen = BIO_pending(bio_private);
	char *pem_key = (char *)(calloc(keylen + 1, 1)); /* Null-terminate */
	BIO_read(bio_private, pem_key, keylen);
	BIO_free(bio_private);
	string dest(pem_key);
	free(pem_key);
	return dest;
}